

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_optimizeTrainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t *parameters)

{
  ulong uVar1;
  ZDICT_cover_params_t parameters_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  clock_t cVar5;
  ulong in_RSI;
  void *in_RDI;
  int in_R8D;
  uint *in_R9;
  size_t compressedSize;
  size_t dictSize;
  COVER_tryParameters_data_t *data;
  size_t initVal;
  COVER_ctx_t ctx;
  int warned;
  POOL_ctx *pool;
  COVER_best_t best;
  uint k;
  uint d;
  uint iteration;
  int displayLevel;
  uint shrinkDict;
  uint kIterations;
  uint kStepSize;
  uint kSteps;
  uint kMaxK;
  uint kMinK;
  uint kMaxD;
  uint kMinD;
  double splitPoint;
  uint nbThreads;
  undefined4 uVar6;
  int in_stack_fffffffffffffe04;
  POOL_function in_stack_fffffffffffffe08;
  POOL_ctx *in_stack_fffffffffffffe10;
  int local_1d0;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  double local_1b0;
  double in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  size_t *in_stack_fffffffffffffe68;
  void *in_stack_fffffffffffffe70;
  COVER_ctx_t *in_stack_fffffffffffffe78;
  POOL_ctx *local_128;
  undefined1 local_120 [32];
  void *in_stack_ffffffffffffff00;
  void *local_c0;
  size_t local_b8;
  undefined1 auStack_b0 [48];
  size_t local_80;
  uint local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  undefined4 local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  double local_48;
  uint local_3c;
  uint *local_38;
  ulong local_18;
  void *local_10;
  size_t local_8;
  
  local_3c = in_R9[3];
  if (0.0 < *(double *)(in_R9 + 4)) {
    local_1b0 = *(double *)(in_R9 + 4);
  }
  else {
    local_1b0 = 1.0;
  }
  local_48 = local_1b0;
  if (in_R9[1] == 0) {
    local_1b4 = 6;
  }
  else {
    local_1b4 = in_R9[1];
  }
  local_4c = local_1b4;
  if (in_R9[1] == 0) {
    local_1b8 = 8;
  }
  else {
    local_1b8 = in_R9[1];
  }
  local_50 = local_1b8;
  if (*in_R9 == 0) {
    local_1bc = 0x32;
  }
  else {
    local_1bc = *in_R9;
  }
  local_54 = local_1bc;
  if (*in_R9 == 0) {
    local_1c0 = 2000;
  }
  else {
    local_1c0 = *in_R9;
  }
  local_58 = local_1c0;
  if (in_R9[2] == 0) {
    local_1c4 = 0x28;
  }
  else {
    local_1c4 = in_R9[2];
  }
  local_5c = local_1c4;
  if ((local_1c0 - local_1bc) / local_1c4 < 2) {
    local_1c8 = 1;
  }
  else {
    local_1c8 = (local_1c0 - local_1bc) / local_1c4;
  }
  local_60 = local_1c8;
  uVar1 = (ulong)(local_1c0 - local_1bc) % (ulong)local_1c8;
  local_64 = ((local_1b8 - local_1b4 >> 1) + 1) * ((local_1c0 - local_1bc) / local_1c8 + 1);
  local_68 = 0;
  local_6c = in_R9[9];
  local_70 = 1;
  local_128 = (POOL_ctx *)0x0;
  bVar2 = false;
  if ((local_1b0 <= 0.0) || (1.0 < local_1b0)) {
    if (0 < (int)local_6c) {
      fprintf(_stderr,"Incorrect parameters\n",uVar1);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffd6;
  }
  else if ((local_1bc < local_1b8) || (local_1c0 < local_1bc)) {
    if (0 < (int)local_6c) {
      fprintf(_stderr,"Incorrect parameters\n",uVar1);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffd6;
  }
  else if (in_R8D == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Cover must have at least one input file\n",uVar1);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (in_RSI < 0x100) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffba;
  }
  else {
    local_38 = in_R9;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((local_3c < 2) ||
       (local_128 = POOL_create((size_t)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08)
       , local_128 != (POOL_ctx *)0x0)) {
      COVER_best_init((COVER_best_t *)0x292f4f);
      if (local_6c == 0) {
        local_1d0 = 0;
      }
      else {
        local_1d0 = local_6c - 1;
      }
      g_displayLevel = local_1d0;
      if (1 < (int)local_6c) {
        fprintf(_stderr,"Trying %u different sets of parameters\n",(ulong)local_64);
        fflush(_stderr);
      }
      for (local_74 = local_4c; local_74 <= local_50; local_74 = local_74 + 2) {
        if (2 < (int)local_6c) {
          fprintf(_stderr,"d=%u\n",(ulong)local_74);
          fflush(_stderr);
        }
        in_stack_fffffffffffffe70 =
             (void *)COVER_ctx_init(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                    in_stack_fffffffffffffe68,
                                    (uint)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                                    (uint)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        uVar3 = ZSTD_isError(0x29304f);
        if (uVar3 != 0) {
          if (0 < (int)local_6c) {
            fprintf(_stderr,"Failed to initialize context\n");
            fflush(_stderr);
          }
          COVER_best_destroy((COVER_best_t *)0x293092);
          POOL_free(in_stack_fffffffffffffe10);
          return (size_t)in_stack_fffffffffffffe70;
        }
        if (!bVar2) {
          COVER_warnOnSmallCorpus
                    ((size_t)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08,
                     in_stack_fffffffffffffe04);
          bVar2 = true;
        }
        for (local_78 = local_54; local_78 <= local_58; local_78 = local_60 + local_78) {
          in_stack_fffffffffffffe68 = (size_t *)malloc(0x48);
          if (2 < (int)local_6c) {
            fprintf(_stderr,"k=%u\n",(ulong)local_78);
            fflush(_stderr);
          }
          if (in_stack_fffffffffffffe68 == (size_t *)0x0) {
            if (0 < (int)local_6c) {
              fprintf(_stderr,"Failed to allocate parameters\n");
              fflush(_stderr);
            }
            COVER_best_destroy((COVER_best_t *)0x293191);
            COVER_ctx_destroy((COVER_ctx_t *)0x29319e);
            POOL_free(in_stack_fffffffffffffe10);
            return 0xffffffffffffffc0;
          }
          *in_stack_fffffffffffffe68 = (size_t)&stack0xfffffffffffffe78;
          in_stack_fffffffffffffe68[1] = (size_t)local_120;
          in_stack_fffffffffffffe68[2] = local_18;
          memcpy(in_stack_fffffffffffffe68 + 3,local_38,0x30);
          *(uint *)(in_stack_fffffffffffffe68 + 3) = local_78;
          *(uint *)((long)in_stack_fffffffffffffe68 + 0x1c) = local_74;
          in_stack_fffffffffffffe68[5] = (size_t)local_48;
          *(uint *)(in_stack_fffffffffffffe68 + 4) = local_5c;
          *(undefined4 *)(in_stack_fffffffffffffe68 + 6) = 0;
          *(int *)((long)in_stack_fffffffffffffe68 + 0x3c) = g_displayLevel;
          in_stack_fffffffffffffe08 = (POOL_function)in_stack_fffffffffffffe68[5];
          in_stack_fffffffffffffe10 = (POOL_ctx *)in_stack_fffffffffffffe68[6];
          uVar6 = (undefined4)in_stack_fffffffffffffe68[4];
          in_stack_fffffffffffffe04 = (int)(in_stack_fffffffffffffe68[4] >> 0x20);
          parameters_00.nbThreads = in_stack_fffffffffffffe04;
          parameters_00._0_12_ = *(undefined1 (*) [12])(in_stack_fffffffffffffe68 + 3);
          parameters_00.splitPoint = (double)in_stack_fffffffffffffe08;
          parameters_00._24_8_ = in_stack_fffffffffffffe10;
          parameters_00.zParams._0_8_ = in_stack_fffffffffffffe68[7];
          parameters_00._40_8_ = in_stack_fffffffffffffe68[8];
          iVar4 = COVER_checkParameters(parameters_00,local_18);
          if (iVar4 == 0) {
            if (0 < g_displayLevel) {
              fprintf(_stderr,"Cover parameters incorrect\n");
              fflush(_stderr);
            }
            free(in_stack_fffffffffffffe68);
          }
          else {
            COVER_best_start((COVER_best_t *)0x2932e3);
            if (local_128 == (POOL_ctx *)0x0) {
              COVER_tryParameters(in_stack_ffffffffffffff00);
            }
            else {
              POOL_add(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (void *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
            }
            if ((1 < (int)local_6c) &&
               ((cVar5 = clock(), 150000 < cVar5 - g_time || (3 < (int)local_6c)))) {
              g_time = clock();
              fprintf(_stderr,"\r%u%%       ",(ulong)(uint)(local_70 * 100) / (ulong)local_64);
              fflush(_stderr);
            }
            local_70 = local_70 + 1;
          }
        }
        COVER_best_wait((COVER_best_t *)0x2933bb);
        COVER_ctx_destroy((COVER_ctx_t *)0x2933c8);
      }
      if (1 < (int)local_6c) {
        fprintf(_stderr,"\r%79s\r","");
        fflush(_stderr);
      }
      uVar3 = ZSTD_isError(0x293430);
      if (uVar3 == 0) {
        memcpy(local_38,auStack_b0,0x30);
        memcpy(local_10,local_c0,local_b8);
        COVER_best_destroy((COVER_best_t *)0x2934b0);
        POOL_free(in_stack_fffffffffffffe10);
        local_8 = local_b8;
      }
      else {
        COVER_best_destroy((COVER_best_t *)0x29344f);
        POOL_free(in_stack_fffffffffffffe10);
        local_8 = local_80;
      }
    }
    else {
      local_8 = 0xffffffffffffffc0;
    }
  }
  return local_8;
}

Assistant:

ZDICTLIB_API size_t ZDICT_optimizeTrainFromBuffer_cover(
    void* dictBuffer, size_t dictBufferCapacity, const void* samplesBuffer,
    const size_t* samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t* parameters)
{
  /* constants */
  const unsigned nbThreads = parameters->nbThreads;
  const double splitPoint =
      parameters->splitPoint <= 0.0 ? COVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
  const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
  const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
  const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
  const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
  const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
  const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
  const unsigned kIterations =
      (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
  const unsigned shrinkDict = 0;
  /* Local variables */
  const int displayLevel = parameters->zParams.notificationLevel;
  unsigned iteration = 1;
  unsigned d;
  unsigned k;
  COVER_best_t best;
  POOL_ctx *pool = NULL;
  int warned = 0;

  /* Checks */
  if (splitPoint <= 0 || splitPoint > 1) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (kMinK < kMaxD || kMaxK < kMinK) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  if (nbThreads > 1) {
    pool = POOL_create(nbThreads, 1);
    if (!pool) {
      return ERROR(memory_allocation);
    }
  }
  /* Initialization */
  COVER_best_init(&best);
  /* Turn down global display level to clean up display at level 2 and below */
  g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
  /* Loop through d first because each new value needs a new context */
  LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                    kIterations);
  for (d = kMinD; d <= kMaxD; d += 2) {
    /* Initialize the context for this value of d */
    COVER_ctx_t ctx;
    LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
    {
      const size_t initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint);
      if (ZSTD_isError(initVal)) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
        COVER_best_destroy(&best);
        POOL_free(pool);
        return initVal;
      }
    }
    if (!warned) {
      COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, displayLevel);
      warned = 1;
    }
    /* Loop through k reusing the same context */
    for (k = kMinK; k <= kMaxK; k += kStepSize) {
      /* Prepare the arguments */
      COVER_tryParameters_data_t *data = (COVER_tryParameters_data_t *)malloc(
          sizeof(COVER_tryParameters_data_t));
      LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
      if (!data) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
        COVER_best_destroy(&best);
        COVER_ctx_destroy(&ctx);
        POOL_free(pool);
        return ERROR(memory_allocation);
      }
      data->ctx = &ctx;
      data->best = &best;
      data->dictBufferCapacity = dictBufferCapacity;
      data->parameters = *parameters;
      data->parameters.k = k;
      data->parameters.d = d;
      data->parameters.splitPoint = splitPoint;
      data->parameters.steps = kSteps;
      data->parameters.shrinkDict = shrinkDict;
      data->parameters.zParams.notificationLevel = g_displayLevel;
      /* Check the parameters */
      if (!COVER_checkParameters(data->parameters, dictBufferCapacity)) {
        DISPLAYLEVEL(1, "Cover parameters incorrect\n");
        free(data);
        continue;
      }
      /* Call the function and pass ownership of data to it */
      COVER_best_start(&best);
      if (pool) {
        POOL_add(pool, &COVER_tryParameters, data);
      } else {
        COVER_tryParameters(data);
      }
      /* Print status */
      LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                         (unsigned)((iteration * 100) / kIterations));
      ++iteration;
    }
    COVER_best_wait(&best);
    COVER_ctx_destroy(&ctx);
  }
  LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
  /* Fill the output buffer and parameters with output of the best parameters */
  {
    const size_t dictSize = best.dictSize;
    if (ZSTD_isError(best.compressedSize)) {
      const size_t compressedSize = best.compressedSize;
      COVER_best_destroy(&best);
      POOL_free(pool);
      return compressedSize;
    }
    *parameters = best.parameters;
    memcpy(dictBuffer, best.dict, dictSize);
    COVER_best_destroy(&best);
    POOL_free(pool);
    return dictSize;
  }
}